

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O1

ulong __thiscall nuraft::inmem_log_store::append(inmem_log_store *this,ptr<log_entry> *entry)

{
  mapped_type mVar1;
  int iVar2;
  mapped_type *pmVar3;
  long lVar4;
  mapped_type *pmVar5;
  size_t idx;
  ptr<log_entry> clone;
  mapped_type local_38;
  ptr<log_entry> local_30;
  key_type local_20;
  
  make_clone(&local_30);
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->logs_lock_);
  if (iVar2 == 0) {
    local_38 = ((this->start_idx_).super___atomic_base<unsigned_long>._M_i +
               (this->logs_)._M_t._M_impl.super__Rb_tree_header._M_node_count) - 1;
    pmVar3 = std::
             map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
             ::operator[](&this->logs_,&local_38);
    (pmVar3->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         local_30.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar3->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount,
               &local_30.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if ((this->disk_emul_delay).super___atomic_base<unsigned_long>._M_i != 0) {
      lVar4 = std::chrono::_V2::system_clock::now();
      mVar1 = local_38;
      local_20 = (this->disk_emul_delay).super___atomic_base<unsigned_long>._M_i * 1000 +
                 lVar4 / 1000;
      pmVar5 = std::
               map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
               ::operator[](&this->disk_emul_logs_being_written_,&local_20);
      *pmVar5 = mVar1;
      EventAwaiter::invoke(&this->disk_emul_ea_);
    }
    mVar1 = local_38;
    pthread_mutex_unlock((pthread_mutex_t *)&this->logs_lock_);
    if (local_30.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    return mVar1;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

ulong inmem_log_store::append(ptr<log_entry>& entry) {
    ptr<log_entry> clone = make_clone(entry);

    std::lock_guard<std::mutex> l(logs_lock_);
    size_t idx = start_idx_ + logs_.size() - 1;
    logs_[idx] = clone;

    if (disk_emul_delay) {
        uint64_t cur_time = timer_helper::get_timeofday_us();
        disk_emul_logs_being_written_[cur_time + disk_emul_delay * 1000] = idx;
        disk_emul_ea_.invoke();
    }

    return idx;
}